

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3ColumnColl(Column *pCol)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if ((pCol->colFlags >> 9 & 1) != 0) {
    pcVar2 = pCol->zCnName + -1;
    do {
      pcVar3 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar3 != '\0');
    pcVar3 = pcVar2;
    if ((pCol->colFlags & 4) != 0) {
      do {
        pcVar2 = pcVar3 + 1;
        pcVar1 = pcVar3 + 1;
        pcVar3 = pcVar2;
      } while (*pcVar1 != '\0');
    }
    return pcVar2 + 1;
  }
  return (char *)0x0;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3ColumnColl(Column *pCol){
  const char *z;
  if( (pCol->colFlags & COLFLAG_HASCOLL)==0 ) return 0;
  z = pCol->zCnName;
  while( *z ){ z++; }
  if( pCol->colFlags & COLFLAG_HASTYPE ){
    do{ z++; }while( *z );
  }
  return z+1;
}